

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::
write_byte_string<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_byte_string_from_buffer>
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          read_byte_string_from_buffer *read,item_event_visitor *visitor,error_code *ec)

{
  byte bVar1;
  uint8_t tag_00;
  bool bVar2;
  type_conflict5 tVar3;
  type_conflict3 tVar4;
  type_conflict4 tVar5;
  type_conflict tVar6;
  endian eVar7;
  type_conflict2 tVar8;
  type_conflict6 tVar9;
  size_t sVar10;
  size_type sVar11;
  error_code *in_RCX;
  string_view_type *in_RDX;
  long in_RDI;
  type_conflict7 tVar12;
  type_conflict1 tVar13;
  size_t i_8;
  size_t size_11;
  double *data_11;
  size_t bytes_per_elem_8;
  endian e_8;
  uint8_t tag_8;
  size_t i_7;
  size_t size_10;
  float *data_10;
  size_t bytes_per_elem_7;
  endian e_7;
  uint8_t tag_7;
  size_t i_6;
  size_t size_9;
  uint16_t *data_9;
  size_t bytes_per_elem_6;
  endian e_6;
  uint8_t tag_6;
  size_t i_5;
  size_t size_8;
  int64_t *data_8;
  size_t bytes_per_elem_5;
  endian e_5;
  uint8_t tag_5;
  size_t i_4;
  size_t size_7;
  int32_t *data_7;
  size_t bytes_per_elem_4;
  endian e_4;
  uint8_t tag_4;
  size_t i_3;
  size_t size_6;
  int16_t *data_6;
  size_t bytes_per_elem_3;
  endian e_3;
  uint8_t tag_3;
  size_t size_5;
  int8_t *data_5;
  size_t i_2;
  size_t size_4;
  uint64_t *data_4;
  size_t bytes_per_elem_2;
  endian e_2;
  uint8_t tag_2;
  size_t i_1;
  size_t size_3;
  uint32_t *data_3;
  size_t bytes_per_elem_1;
  endian e_1;
  uint8_t tag_1;
  size_t i;
  size_t size_2;
  uint16_t *data_2;
  size_t bytes_per_elem;
  endian e;
  uint8_t tag;
  size_t size_1;
  uint8_t *data_1;
  size_t size;
  uint8_t *data;
  bigint n_1;
  bigint n;
  ser_context *in_stack_fffffffffffffbc8;
  undefined1 __x;
  string_view_type *in_stack_fffffffffffffbd0;
  string_view_type *in_stack_fffffffffffffbd8;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffbe0;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffbe8;
  error_code *in_stack_fffffffffffffbf0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffbf8;
  read_byte_string_from_buffer *in_stack_fffffffffffffc00;
  semantic_tag sVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc08;
  basic_item_event_visitor<char> *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc88;
  _WordT *in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc9c;
  span<const_double,_18446744073709551615UL> local_360;
  ulong local_350;
  ulong local_348;
  pointer local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  span<const_float,_18446744073709551615UL> local_328;
  ulong local_318;
  ulong local_310;
  pointer local_308;
  size_t local_300;
  endian local_2f8;
  uint8_t local_2f1;
  span<const_unsigned_short,_18446744073709551615UL> local_2f0;
  ulong local_2d8;
  ulong local_2d0;
  pointer local_2c8;
  size_t local_2c0;
  endian local_2b8;
  uint8_t local_2b1;
  span<const_long,_18446744073709551615UL> local_2b0;
  ulong local_2a0;
  ulong local_298;
  pointer local_290;
  size_t local_288;
  endian local_280;
  uint8_t local_279;
  span<const_int,_18446744073709551615UL> local_278;
  ulong local_268;
  ulong local_260;
  pointer local_258;
  size_t local_250;
  endian local_248;
  uint8_t local_241;
  span<const_short,_18446744073709551615UL> local_240;
  ulong local_230;
  ulong local_228;
  pointer local_220;
  size_t local_218;
  endian local_210;
  uint8_t local_209;
  span<const_signed_char,_18446744073709551615UL> local_208;
  size_type local_1f8;
  uchar *local_1f0;
  span<const_unsigned_long,_18446744073709551615UL> local_1e8;
  ulong local_1d8;
  ulong local_1d0;
  pointer local_1c8;
  size_t local_1c0;
  endian local_1b8;
  uint8_t local_1b1;
  span<const_unsigned_int,_18446744073709551615UL> local_1b0;
  ulong local_1a0;
  ulong local_198;
  pointer local_190;
  size_t local_188;
  endian local_180;
  uint8_t local_179;
  span<const_unsigned_short,_18446744073709551615UL> local_178;
  ulong local_168;
  ulong local_160;
  pointer local_158;
  size_t local_150;
  endian local_148;
  uint8_t local_141;
  span<const_unsigned_char,_18446744073709551615UL> local_140;
  size_type local_130;
  pointer local_128;
  span<const_unsigned_char,_18446744073709551615UL> local_120;
  size_type local_110;
  pointer local_108;
  undefined1 local_100 [16];
  undefined1 local_78 [16];
  reference local_30;
  error_code *local_20;
  string_view_type *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::bitset<3UL>::operator[]
            ((bitset<3UL> *)in_stack_fffffffffffffbd8,(size_t)in_stack_fffffffffffffbd0);
  bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffbd0);
  std::bitset<3UL>::reference::~reference(&local_30);
  if ((bVar1 & 1) == 0) {
    read_byte_string_from_buffer::operator()
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    sVar14 = (semantic_tag)((ulong)in_stack_fffffffffffffc00 >> 0x38);
    tVar6 = (type_conflict)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
    bVar2 = std::error_code::operator_cast_to_bool(local_20);
    if (!bVar2) {
      basic_item_event_visitor<char>::
      byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,sVar14,
                 (ser_context *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,tVar6);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
    }
  }
  else {
    switch(*(undefined8 *)(in_RDI + 0x10)) {
    case 2:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a75c4);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a7629);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x80));
      basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                (in_stack_fffffffffffffc9c,(uint8_t *)in_stack_fffffffffffffc90,
                 CONCAT17(bVar1,in_stack_fffffffffffffc88));
      std::__cxx11::string::clear();
      basic_bigint<std::allocator<unsigned_char>>::
      write_string<char,std::char_traits<char>,std::allocator<char>>
                ((basic_bigint<std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8);
      local_78 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x60))
      ;
      basic_item_event_visitor<char>::string_value
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 in_stack_fffffffffffffbd8,(semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),
                 in_stack_fffffffffffffbc8,(error_code *)0x2a76ee);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbd0);
      break;
    case 3:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a7750);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a77b2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x80));
      basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                (in_stack_fffffffffffffc9c,(uint8_t *)in_stack_fffffffffffffc90,
                 CONCAT17(bVar1,in_stack_fffffffffffffc88));
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint<int>
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf0,
                 (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),in_stack_fffffffffffffbe0);
      jsoncons::operator-(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
      basic_bigint<std::allocator<unsigned_char>_>::operator=
                (in_stack_fffffffffffffbe0,
                 (basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbd8);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbd0);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbd0);
      std::__cxx11::string::clear();
      basic_bigint<std::allocator<unsigned_char>>::
      write_string<char,std::char_traits<char>,std::allocator<char>>
                ((basic_bigint<std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8);
      local_100 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(in_RDI + 0x60));
      basic_item_event_visitor<char>::string_value
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 in_stack_fffffffffffffbd8,(semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),
                 in_stack_fffffffffffffbc8,(error_code *)0x2a78c2);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbd0);
      break;
    default:
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      tVar6 = (type_conflict)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      basic_item_event_visitor<char>::
      byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                 (uint64_t)in_stack_fffffffffffffc00,(ser_context *)in_stack_fffffffffffffbf8,
                 in_stack_fffffffffffffbf0,tVar6);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x15:
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      sVar14 = (semantic_tag)((ulong)in_stack_fffffffffffffc00 >> 0x38);
      tVar6 = (type_conflict)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      basic_item_event_visitor<char>::
      byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,sVar14,
                 (ser_context *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,tVar6);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x16:
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      sVar14 = (semantic_tag)((ulong)in_stack_fffffffffffffc00 >> 0x38);
      tVar6 = (type_conflict)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      basic_item_event_visitor<char>::
      byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,sVar14,
                 (ser_context *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,tVar6);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x17:
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      sVar14 = (semantic_tag)((ulong)in_stack_fffffffffffffc00 >> 0x38);
      tVar6 = (type_conflict)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      basic_item_event_visitor<char>::
      byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,sVar14,
                 (ser_context *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,tVar6);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x40:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a7b26);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_108 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a7b86);
      local_110 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (in_RDI + 0xb0));
      jsoncons::detail::span<const_unsigned_char,_18446744073709551615UL>::span
                (&local_120,local_108,local_110);
      basic_item_event_visitor<char>::typed_array<unsigned_char_const>
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 (span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),in_stack_fffffffffffffbc8,
                 (error_code *)0x2a7bf8);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x41:
    case 0x45:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a7d27);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_141 = (uint8_t)*(undefined8 *)(in_RDI + 0x10);
      local_148 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_endianness(local_141);
      local_150 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_bytes_per_element(local_141);
      local_158 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      0x2a7dc3);
      sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb0));
      local_160 = sVar11 / local_150;
      if (local_148 != little) {
        for (local_168 = 0; local_168 < local_160; local_168 = local_168 + 1) {
          tVar4 = binary::byte_swap<unsigned_short>(local_158[local_168]);
          local_158[local_168] = tVar4;
        }
      }
      jsoncons::detail::span<const_unsigned_short,_18446744073709551615UL>::span
                (&local_178,local_158,local_160);
      basic_item_event_visitor<char>::typed_array<unsigned_short_const>
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 (span<const_unsigned_short,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),in_stack_fffffffffffffbc8,
                 (error_code *)0x2a7eb4);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x42:
    case 0x46:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a7ee1);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_179 = (uint8_t)*(undefined8 *)(in_RDI + 0x10);
      local_180 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_endianness(local_179);
      local_188 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_bytes_per_element(local_179);
      local_190 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      0x2a7f7d);
      sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb0));
      local_198 = sVar11 / local_188;
      if (local_180 != little) {
        for (local_1a0 = 0; local_1a0 < local_198; local_1a0 = local_1a0 + 1) {
          tVar5 = binary::byte_swap<unsigned_int>(local_190[local_1a0]);
          local_190[local_1a0] = tVar5;
        }
      }
      jsoncons::detail::span<const_unsigned_int,_18446744073709551615UL>::span
                (&local_1b0,local_190,local_198);
      basic_item_event_visitor<char>::typed_array<unsigned_int_const>
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 (span<const_unsigned_int,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),in_stack_fffffffffffffbc8,
                 (error_code *)0x2a806b);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x43:
    case 0x47:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a8098);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_1b1 = (uint8_t)*(undefined8 *)(in_RDI + 0x10);
      local_1b8 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_endianness(local_1b1);
      local_1c0 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_bytes_per_element(local_1b1);
      local_1c8 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      0x2a8134);
      sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb0));
      local_1d0 = sVar11 / local_1c0;
      if (local_1b8 != little) {
        for (local_1d8 = 0; local_1d8 < local_1d0; local_1d8 = local_1d8 + 1) {
          tVar8 = binary::byte_swap<unsigned_long>(local_1c8[local_1d8]);
          local_1c8[local_1d8] = tVar8;
        }
      }
      jsoncons::detail::span<const_unsigned_long,_18446744073709551615UL>::span
                (&local_1e8,local_1c8,local_1d0);
      basic_item_event_visitor<char>::typed_array<unsigned_long_const>
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 (span<const_unsigned_long,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),in_stack_fffffffffffffbc8,
                 (error_code *)0x2a8225);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x44:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a7c25);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_128 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a7c85);
      local_130 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (in_RDI + 0xb0));
      jsoncons::detail::span<const_unsigned_char,_18446744073709551615UL>::span
                (&local_140,local_128,local_130);
      basic_item_event_visitor<char>::typed_array<unsigned_char_const>
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 (span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),in_stack_fffffffffffffbc8,
                 (error_code *)0x2a7cfa);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x48:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a8252);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_1f0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a82b2);
      local_1f8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (in_RDI + 0xb0));
      jsoncons::detail::span<const_signed_char,_18446744073709551615UL>::span
                (&local_208,(pointer)local_1f0,local_1f8);
      basic_item_event_visitor<char>::typed_array<signed_char_const>
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 (span<const_signed_char,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),in_stack_fffffffffffffbc8,
                 (error_code *)0x2a8324);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x49:
    case 0x4d:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a8351);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_209 = (uint8_t)*(undefined8 *)(in_RDI + 0x10);
      local_210 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_endianness(local_209);
      local_218 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_bytes_per_element(local_209);
      local_220 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      0x2a83ed);
      sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb0));
      local_228 = sVar11 / local_218;
      if (local_210 != little) {
        for (local_230 = 0; local_230 < local_228; local_230 = local_230 + 1) {
          tVar3 = binary::byte_swap<short>(local_220[local_230]);
          local_220[local_230] = tVar3;
        }
      }
      jsoncons::detail::span<const_short,_18446744073709551615UL>::span
                (&local_240,local_220,local_228);
      basic_item_event_visitor<char>::typed_array<short_const>
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 (span<const_short,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),in_stack_fffffffffffffbc8,
                 (error_code *)0x2a84de);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x4a:
    case 0x4e:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a850b);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_241 = (uint8_t)*(undefined8 *)(in_RDI + 0x10);
      local_248 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_endianness(local_241);
      local_250 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_bytes_per_element(local_241);
      local_258 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      0x2a85a7);
      sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb0));
      local_260 = sVar11 / local_250;
      if (local_248 != little) {
        for (local_268 = 0; local_268 < local_260; local_268 = local_268 + 1) {
          tVar6 = binary::byte_swap<int>(local_258[local_268]);
          local_258[local_268] = tVar6;
        }
      }
      jsoncons::detail::span<const_int,_18446744073709551615UL>::span
                (&local_278,local_258,local_260);
      basic_item_event_visitor<char>::typed_array<int_const>
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 (span<const_int,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),in_stack_fffffffffffffbc8,
                 (error_code *)0x2a8695);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x4b:
    case 0x4f:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a86c2);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_279 = (uint8_t)*(undefined8 *)(in_RDI + 0x10);
      local_280 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_endianness(local_279);
      local_288 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_bytes_per_element(local_279);
      local_290 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      0x2a875e);
      sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb0));
      local_298 = sVar11 / local_288;
      if (local_280 != little) {
        for (local_2a0 = 0; local_2a0 < local_298; local_2a0 = local_2a0 + 1) {
          tVar9 = binary::byte_swap<long>(local_290[local_2a0]);
          local_290[local_2a0] = tVar9;
        }
      }
      jsoncons::detail::span<const_long,_18446744073709551615UL>::span
                (&local_2b0,local_290,local_298);
      basic_item_event_visitor<char>::typed_array<long_const>
                ((basic_item_event_visitor<char> *)local_18,
                 (span<const_long,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),in_stack_fffffffffffffbc8,
                 (error_code *)0x2a884f);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      break;
    case 0x50:
    case 0x54:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a887c);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_2b1 = (uint8_t)*(undefined8 *)(in_RDI + 0x10);
      local_2b8 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_endianness(local_2b1);
      local_2c0 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_bytes_per_element(local_2b1);
      local_2c8 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      0x2a8918);
      sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb0));
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      local_2d0 = sVar11 / local_2c0;
      if (local_2b8 != little) {
        for (local_2d8 = 0; __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38),
            local_2d8 < local_2d0; local_2d8 = local_2d8 + 1) {
          tVar4 = binary::byte_swap<unsigned_short>(local_2c8[local_2d8]);
          local_2c8[local_2d8] = tVar4;
        }
      }
      jsoncons::detail::span<const_unsigned_short,_18446744073709551615UL>::span
                (&local_2f0,local_2c8,local_2d0);
      basic_item_event_visitor<char>::typed_array
                ((basic_item_event_visitor<char> *)local_18,&local_2f0,0,in_RDI,local_20);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      in_stack_fffffffffffffbd8 = local_18;
      break;
    case 0x51:
    case 0x55:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a8a36);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      local_2f1 = (uint8_t)*(undefined8 *)(in_RDI + 0x10);
      local_2f8 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_endianness(local_2f1);
      local_300 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
                  get_typed_array_bytes_per_element(local_2f1);
      local_308 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      0x2a8ad2);
      sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb0));
      local_310 = sVar11 / local_300;
      if (local_2f8 != little) {
        for (local_318 = 0; local_318 < local_310; local_318 = local_318 + 1) {
          tVar12 = binary::byte_swap<float>((float)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
          local_308[local_318] = tVar12;
        }
      }
      jsoncons::detail::span<const_float,_18446744073709551615UL>::span
                (&local_328,local_308,local_310);
      basic_item_event_visitor<char>::typed_array<float_const>
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 (span<const_float,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (semantic_tag)((ulong)local_18 >> 0x38),in_stack_fffffffffffffbc8,
                 (error_code *)0x2a8bc2);
      __x = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
      in_stack_fffffffffffffbd0 = local_18;
      break;
    case 0x52:
    case 0x56:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2a8bef);
      read_byte_string_from_buffer::operator()
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      bVar2 = std::error_code::operator_cast_to_bool(local_20);
      if (bVar2) {
        *(undefined1 *)(in_RDI + 8) = 0;
        return;
      }
      tag_00 = (uint8_t)*(undefined8 *)(in_RDI + 0x10);
      eVar7 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
              get_typed_array_endianness(tag_00);
      sVar10 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
               get_typed_array_bytes_per_element(tag_00);
      local_340 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      0x2a8c8b);
      sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb0));
      local_348 = sVar11 / sVar10;
      if (eVar7 != little) {
        for (local_350 = 0; local_350 < local_348; local_350 = local_350 + 1) {
          tVar13 = binary::byte_swap<double>((double)in_stack_fffffffffffffbe0);
          local_340[local_350] = tVar13;
        }
      }
      jsoncons::detail::span<const_double,_18446744073709551615UL>::span
                (&local_360,local_340,local_348);
      basic_item_event_visitor<char>::typed_array<double_const>
                ((basic_item_event_visitor<char> *)in_stack_fffffffffffffbe0,
                 (span<const_double,_18446744073709551615UL> *)in_stack_fffffffffffffbd8,
                 (semantic_tag)((ulong)in_stack_fffffffffffffbd0 >> 0x38),(ser_context *)local_18,
                 (error_code *)0x2a8d79);
      __x = (undefined1)((ulong)local_18 >> 0x38);
      *(byte *)(in_RDI + 8) = (*(byte *)(in_RDI + 10) ^ 0xff) & 1;
    }
    std::bitset<3UL>::operator[]
              ((bitset<3UL> *)in_stack_fffffffffffffbd8,(size_t)in_stack_fffffffffffffbd0);
    std::bitset<3UL>::reference::operator=((reference *)in_stack_fffffffffffffbd0,(bool)__x);
    std::bitset<3UL>::reference::~reference((reference *)&stack0xfffffffffffffc90);
  }
  return;
}

Assistant:

void write_byte_string(Read read, item_event_visitor& visitor, std::error_code& ec)
    {
        if (other_tags_[item_tag])
        {
            switch (raw_tag_)
            {
                case 0x2:
                {
                    bytes_buffer_.clear();
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                    text_buffer_.clear();
                    n.write_string(text_buffer_);
                    visitor.string_value(text_buffer_, semantic_tag::bigint, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x3:
                {
                    bytes_buffer_.clear();
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                    n = -1 - n;
                    text_buffer_.clear();
                    n.write_string(text_buffer_);
                    visitor.string_value(text_buffer_, semantic_tag::bigint, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x15:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, semantic_tag::base64url, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x16:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, semantic_tag::base64, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x17:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, semantic_tag::base16, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x40:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    uint8_t* data = reinterpret_cast<uint8_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size();
                    visitor.typed_array(jsoncons::span<const uint8_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x44:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    uint8_t* data = reinterpret_cast<uint8_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size();
                    visitor.typed_array(jsoncons::span<const uint8_t>(data,size), semantic_tag::clamped, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x41:
                case 0x45:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint16_t* data = reinterpret_cast<uint16_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;

                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint16_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const uint16_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x42:
                case 0x46:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag);
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint32_t* data = reinterpret_cast<uint32_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint32_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const uint32_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x43:
                case 0x47:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint64_t* data = reinterpret_cast<uint64_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint64_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const uint64_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x48:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    int8_t* data = reinterpret_cast<int8_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size();
                    visitor.typed_array(jsoncons::span<const int8_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x49:
                case 0x4d:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    int16_t* data = reinterpret_cast<int16_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<int16_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const int16_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x4a:
                case 0x4e:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    int32_t* data = reinterpret_cast<int32_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<int32_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const int32_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x4b:
                case 0x4f:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    int64_t* data = reinterpret_cast<int64_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<int64_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const int64_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x50:
                case 0x54:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint16_t* data = reinterpret_cast<uint16_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint16_t>(data[i]);
                        }
                    }
                    visitor.typed_array(half_arg, jsoncons::span<const uint16_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x51:
                case 0x55:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    float* data = reinterpret_cast<float*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<float>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const float>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x52:
                case 0x56:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    double* data = reinterpret_cast<double*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;

                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<double>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const double>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                default:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, raw_tag_, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
            }
            other_tags_[item_tag] = false;
        }
        else
        {
            read(bytes_buffer_,ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            visitor.byte_string_value(bytes_buffer_, semantic_tag::none, *this, ec);
            more_ = !cursor_mode_;
        }
    }